

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O2

int __thiscall Cleaner::CleanTargets(Cleaner *this,int target_count,char **targets)

{
  StringPiece path;
  bool bVar1;
  Node *target;
  ulong uVar2;
  string target_name;
  uint64_t slash_bits;
  string local_58;
  allocator<char> local_38 [8];
  
  Reset(this);
  PrintHeader(this);
  LoadDyndeps(this);
  if (target_count < 1) {
    target_count = 0;
  }
  for (uVar2 = 0; (uint)target_count != uVar2; uVar2 = uVar2 + 1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,targets[uVar2],local_38);
    if (local_58._M_string_length == 0) {
      Error("failed to canonicalize \'\': empty path");
      this->status_ = 1;
    }
    else {
      CanonicalizePath(&local_58,(uint64_t *)local_38);
      path.len_ = local_58._M_string_length;
      path.str_ = local_58._M_dataplus._M_p;
      target = State::LookupNode(this->state_,path);
      if (target == (Node *)0x0) {
        Error("unknown target \'%s\'",local_58._M_dataplus._M_p);
        this->status_ = 1;
      }
      else {
        bVar1 = IsVerbose(this);
        if (bVar1) {
          printf("Target %s\n",local_58._M_dataplus._M_p);
        }
        DoCleanTarget(this,target);
      }
    }
    std::__cxx11::string::~string((string *)&local_58);
  }
  PrintFooter(this);
  return this->status_;
}

Assistant:

int Cleaner::CleanTargets(int target_count, char* targets[]) {
  Reset();
  PrintHeader();
  LoadDyndeps();
  for (int i = 0; i < target_count; ++i) {
    string target_name = targets[i];
    if (target_name.empty()) {
      Error("failed to canonicalize '': empty path");
      status_ = 1;
      continue;
    }
    uint64_t slash_bits;
    CanonicalizePath(&target_name, &slash_bits);
    Node* target = state_->LookupNode(target_name);
    if (target) {
      if (IsVerbose())
        printf("Target %s\n", target_name.c_str());
      DoCleanTarget(target);
    } else {
      Error("unknown target '%s'", target_name.c_str());
      status_ = 1;
    }
  }
  PrintFooter();
  return status_;
}